

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_64.c
# Opt level: O0

sljit_s32 sljit_emit_icall(sljit_compiler *compiler,sljit_s32 type,sljit_s32 arg_types,sljit_s32 src
                          ,sljit_sw srcw)

{
  sljit_s32 sVar1;
  sljit_sw srcw_local;
  sljit_s32 local_20;
  sljit_s32 src_local;
  sljit_s32 arg_types_local;
  sljit_s32 type_local;
  sljit_compiler *compiler_local;
  
  if (compiler->error == 0) {
    srcw_local._4_4_ = src;
    local_20 = arg_types;
    src_local = type;
    _arg_types_local = compiler;
    sVar1 = call_with_args(compiler,arg_types,(sljit_s32 *)((long)&srcw_local + 4),srcw);
    if (sVar1 == 0) {
      compiler_local._4_4_ = sljit_emit_ijump(_arg_types_local,src_local,srcw_local._4_4_,srcw);
    }
    else {
      compiler_local._4_4_ = _arg_types_local->error;
    }
  }
  else {
    compiler_local._4_4_ = compiler->error;
  }
  return compiler_local._4_4_;
}

Assistant:

SLJIT_API_FUNC_ATTRIBUTE sljit_s32 sljit_emit_icall(struct sljit_compiler *compiler, sljit_s32 type,
	sljit_s32 arg_types,
	sljit_s32 src, sljit_sw srcw)
{
	CHECK_ERROR();
	CHECK(check_sljit_emit_icall(compiler, type, arg_types, src, srcw));

	FAIL_IF(call_with_args(compiler, arg_types, &src, srcw));

#if (defined SLJIT_VERBOSE && SLJIT_VERBOSE) \
		|| (defined SLJIT_ARGUMENT_CHECKS && SLJIT_ARGUMENT_CHECKS)
	compiler->skip_checks = 1;
#endif

	return sljit_emit_ijump(compiler, type, src, srcw);
}